

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O2

int stbi__tga_get_comp(int bits_per_pixel,int is_grey,int *is_rgb16)

{
  if (is_rgb16 != (int *)0x0) {
    *is_rgb16 = 0;
  }
  if (bits_per_pixel == 8) {
    return 1;
  }
  if (bits_per_pixel == 0xf) {
    if (is_rgb16 == (int *)0x0) {
      return 3;
    }
  }
  else {
    if ((bits_per_pixel == 0x20) || (bits_per_pixel == 0x18)) {
      return (uint)bits_per_pixel >> 3;
    }
    if (bits_per_pixel != 0x10) {
      return 0;
    }
    if (is_rgb16 == (int *)0x0 || is_grey != 0) {
      return is_grey != 0 ^ 3;
    }
  }
  *is_rgb16 = 1;
  return 3;
}

Assistant:

static int stbi__tga_get_comp(int bits_per_pixel, int is_grey, int* is_rgb16)
{
   // only RGB or RGBA (incl. 16bit) or grey allowed
   if (is_rgb16) *is_rgb16 = 0;
   switch(bits_per_pixel) {
      case 8:  return STBI_grey;
      case 16: if(is_grey) return STBI_grey_alpha;
               // fallthrough
      case 15: if(is_rgb16) *is_rgb16 = 1;
               return STBI_rgb;
      case 24: // fallthrough
      case 32: return bits_per_pixel/8;
      default: return 0;
   }
}